

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode
          (ExclusiveJoinPromiseNode *this,OwnPromiseNode *left,OwnPromiseNode *right,
          SourceLocation location)

{
  SourceLocation location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60 [3];
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  OwnPromiseNode *local_20;
  OwnPromiseNode *right_local;
  OwnPromiseNode *left_local;
  ExclusiveJoinPromiseNode *this_local;
  
  location_00 = location;
  local_20 = right;
  right_local = left;
  left_local = (OwnPromiseNode *)this;
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR_destroy_00d9aa90;
  pOVar1 = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(left);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own(&local_28,pOVar1);
  local_38._0_4_ = location.lineNumber;
  local_38._4_4_ = location.columnNumber;
  location.fileName = location_00.fileName;
  local_48 = location.fileName;
  location.function = location_00.function;
  pcStack_40 = location.function;
  Branch::Branch(&this->left,this,&local_28,location_00);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_28);
  pOVar1 = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(right);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own(local_60,pOVar1);
  Branch::Branch(&this->right,this,local_60,location_00);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(local_60);
  PromiseNode::OnReadyEvent::OnReadyEvent(&this->onReadyEvent);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode(
    OwnPromiseNode left, OwnPromiseNode right, SourceLocation location)
    : left(*this, kj::mv(left), location), right(*this, kj::mv(right), location) {}